

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDXFilmEdgeReader.cpp
# Opt level: O3

Barcode * __thiscall
ZXing::OneD::DXFilmEdgeReader::decodePattern
          (Barcode *__return_storage_ptr__,DXFilmEdgeReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uchar uVar2;
  DXFEState *this_00;
  DXFEState *pDVar3;
  double dVar4;
  _func_int *p_Var5;
  Iterator puVar6;
  uint uVar7;
  pointer __old_p;
  DecodingState *pDVar8;
  Clock *pCVar9;
  ulong uVar10;
  _func_int **pp_Var11;
  DXFEState *pDVar12;
  ushort *puVar13;
  long *plVar14;
  Iterator puVar15;
  byte *pbVar16;
  size_type *psVar17;
  ushort uVar18;
  int iVar19;
  ulong uVar20;
  ushort *puVar21;
  Iterator puVar22;
  ulong uVar23;
  bool bVar24;
  byte bVar25;
  PointI p;
  undefined8 uVar26;
  byte *pbVar27;
  long lVar28;
  int iVar29;
  Iterator puVar30;
  int __val;
  Iterator puVar31;
  ushort *puVar32;
  uint uVar33;
  _func_int **pp_Var34;
  float fVar35;
  pair<const_unsigned_short_*,_const_unsigned_short_*> pVar36;
  int local_13c;
  BitArray dataBits;
  string txt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  Error local_60;
  
  pDVar8 = (state->_M_t).
           super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
           ._M_t.
           super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
           .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl;
  if (pDVar8 == (DecodingState *)0x0) {
    pDVar8 = (DecodingState *)operator_new(0x28);
    pDVar8->_vptr_DecodingState = (_func_int **)&PTR__DXFEState_001f6628;
    pDVar8[2]._vptr_DecodingState = (_func_int **)0x0;
    pDVar8[3]._vptr_DecodingState = (_func_int **)0x0;
    pDVar8[4]._vptr_DecodingState = (_func_int **)0x0;
    (state->_M_t).
    super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    ._M_t.
    super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl = pDVar8;
    *(int *)&pDVar8[1]._vptr_DecodingState = rowNumber;
  }
  if (((undefined1  [12])((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x2)
       == (undefined1  [12])0x0) && (rowNumber < *(int *)&pDVar8[1]._vptr_DecodingState))
  goto LAB_00162670;
  iVar29 = next->_size;
  if (iVar29 < 10) {
    puVar31 = (Iterator)0x0;
    puVar22 = (Iterator)0x0;
    uVar7 = 0;
    puVar30 = (Iterator)0x0;
  }
  else {
    puVar30 = next->_data;
    puVar22 = next->_base;
    puVar31 = next->_end;
    puVar15 = puVar30;
    if (puVar30 == puVar22 + 1) {
      txt._M_dataplus._M_p = *(pointer *)(puVar30 + 1);
      pVar36 = std::__minmax_element<unsigned_short_const*,__gnu_cxx::__ops::_Iter_less_iter>(&txt);
      uVar7 = 4;
      if ((uint)*pVar36.second <= (int)((ulong)*pVar36.first * 0x155555558 >> 0x20) + 1U)
      goto LAB_00162308;
      puVar15 = next->_data;
      iVar29 = next->_size;
    }
    puVar6 = puVar30;
    do {
      puVar30 = puVar6;
      if (puVar15 + (long)iVar29 + -10 <= puVar30) {
        puVar31 = (Iterator)0x0;
        puVar22 = (Iterator)0x0;
        uVar7 = 0;
        puVar30 = (Iterator)0x0;
        goto LAB_00162308;
      }
      uVar18 = puVar30[-1];
      txt._M_dataplus._M_p = *(pointer *)(puVar30 + 1);
      pVar36 = std::__minmax_element<unsigned_short_const*,__gnu_cxx::__ops::_Iter_less_iter>(&txt);
      puVar6 = puVar30 + 2;
    } while ((uVar18 <= *pVar36.first >> 1) ||
            ((int)((ulong)*pVar36.first * 0x155555558 >> 0x20) + 1U < (uint)*pVar36.second));
    uVar7 = 4;
  }
LAB_00162308:
  next->_data = puVar30;
  next->_size = uVar7;
  *(undefined4 *)&next->field_0xc = 0;
  next->_base = puVar22;
  next->_end = puVar31;
  if ((puVar30 < puVar22 || puVar30 == (Iterator)0x0) || puVar31 < puVar30 + uVar7)
  goto LAB_00162670;
  next->_size = 0x19;
  if (puVar30 + 0x19 <= puVar31) {
    if (puVar30 == puVar22 + 1) {
      uVar7 = 0x7fffffff;
    }
    else {
      uVar7 = (uint)puVar30[-1];
    }
    dVar4 = IsPattern<false,25,31>
                      (next,(FixedPattern<25,_31,_false> *)(anonymous_namespace)::CLOCK_PATTERN_FN,
                       uVar7,0.5,0.0);
    bVar24 = true;
    if ((dVar4 == 0.0) && (!NAN(dVar4))) {
      puVar30 = next->_data;
      puVar22 = next->_base;
      puVar31 = next->_end;
      goto LAB_001623a9;
    }
LAB_00162400:
    puVar15 = next->_data;
    puVar30 = next->_base;
    if (puVar30 == puVar15) {
      uVar7 = 0;
    }
    else {
      uVar18 = 0;
      puVar22 = puVar30;
      do {
        uVar18 = uVar18 + *puVar22;
        puVar22 = puVar22 + 1;
      } while (puVar22 != puVar15);
      uVar7 = (uint)uVar18;
    }
    if (puVar30 == puVar15 + next->_size) {
      local_13c = -1;
    }
    else {
      uVar18 = 0;
      do {
        uVar18 = uVar18 + *puVar30;
        puVar30 = puVar30 + 1;
      } while (puVar30 != puVar15 + next->_size);
      local_13c = uVar18 - 1;
    }
    this_00 = (DXFEState *)pDVar8[2]._vptr_DecodingState;
    pDVar3 = (DXFEState *)pDVar8[3]._vptr_DecodingState;
    pCVar9 = anon_unknown_0::DXFEState::findClock(this_00,(int)pDVar3,uVar7);
    if (pCVar9 == (Clock *)0x0) {
      if (pDVar3 == (DXFEState *)pDVar8[4]._vptr_DecodingState) {
        lVar28 = (long)pDVar3 - (long)this_00;
        if (lVar28 == 0x7ffffffffffffff0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar10 = lVar28 >> 4;
        uVar20 = 1;
        if (pDVar3 != this_00) {
          uVar20 = uVar10;
        }
        uVar23 = uVar20 + uVar10;
        if (0x7fffffffffffffe < uVar23) {
          uVar23 = 0x7ffffffffffffff;
        }
        if (CARRY8(uVar20,uVar10)) {
          uVar23 = 0x7ffffffffffffff;
        }
        pp_Var11 = (_func_int **)operator_new(uVar23 * 0x10);
        *(bool *)((long)pp_Var11 + lVar28) = bVar24;
        *(int *)((long)pp_Var11 + lVar28 + 4) = rowNumber;
        *(uint *)((long)pp_Var11 + lVar28 + 8) = uVar7;
        *(int *)((long)pp_Var11 + lVar28 + 0xc) = local_13c;
        pp_Var34 = pp_Var11;
        for (pDVar12 = this_00; pDVar3 != pDVar12; pDVar12 = (DXFEState *)&pDVar12->clocks) {
          p_Var5 = *(_func_int **)&pDVar12->centerRow;
          *pp_Var34 = (_func_int *)(pDVar12->super_DecodingState)._vptr_DecodingState;
          pp_Var34[1] = p_Var5;
          pp_Var34 = pp_Var34 + 2;
        }
        if (this_00 != (DXFEState *)0x0) {
          operator_delete(this_00,(long)pDVar8[4]._vptr_DecodingState - (long)this_00);
        }
        pDVar8[2]._vptr_DecodingState = pp_Var11;
        pDVar8[3]._vptr_DecodingState = pp_Var34 + 2;
        pDVar8[4]._vptr_DecodingState = pp_Var11 + uVar23 * 2;
      }
      else {
        *(bool *)&(pDVar3->super_DecodingState)._vptr_DecodingState = bVar24;
        *(int *)((long)&(pDVar3->super_DecodingState)._vptr_DecodingState + 4) = rowNumber;
        pDVar3->centerRow = uVar7;
        *(int *)&pDVar3->field_0xc = local_13c;
        pDVar8[3]._vptr_DecodingState = pDVar8[3]._vptr_DecodingState + 2;
      }
    }
    else {
      pCVar9->hasFrameNr = bVar24;
      pCVar9->rowNumber = rowNumber;
      pCVar9->xStart = uVar7;
      pCVar9->xStop = local_13c;
    }
    if (next->_data != (Iterator)0x0) {
      next->_data = next->_data + next->_size;
    }
LAB_00162670:
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
LAB_001623a9:
  next->_size = 0x11;
  if (((puVar30 != (Iterator)0x0) && (puVar22 <= puVar30)) && (puVar30 + 0x11 <= puVar31)) {
    if (puVar30 == puVar22 + 1) {
      uVar7 = 0x7fffffff;
    }
    else {
      uVar7 = (uint)puVar30[-1];
    }
    dVar4 = IsPattern<false,17,23>
                      (next,(FixedPattern<17,_23,_false> *)
                            (anonymous_namespace)::CLOCK_PATTERN_NO_FN,uVar7,2.0,0.0);
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      bVar24 = false;
      goto LAB_00162400;
    }
  }
  if (pDVar8[2]._vptr_DecodingState == pDVar8[3]._vptr_DecodingState) goto LAB_00162670;
  puVar15 = next->_data;
  next->_size = 5;
  if (((puVar15 == (Iterator)0x0) || (puVar15 < next->_base)) || (next->_end < puVar15 + 5))
  goto LAB_00162670;
  if (puVar15 == next->_base + 1) {
    uVar7 = 0x7fffffff;
  }
  else {
    uVar7 = (uint)puVar15[-1];
  }
  dVar4 = IsPattern<false,5,5>
                    (next,(FixedPattern<5,_5,_false> *)(anonymous_namespace)::DATA_START_PATTERN,
                     uVar7,0.5,0.0);
  if ((dVar4 == 0.0) && (!NAN(dVar4))) goto LAB_00162670;
  puVar21 = next->_data;
  puVar32 = next->_base;
  if (puVar32 == puVar21) {
    uVar7 = 0;
  }
  else {
    uVar18 = 0;
    puVar13 = puVar32;
    do {
      uVar18 = uVar18 + *puVar13;
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar21);
    uVar7 = (uint)uVar18;
  }
  pCVar9 = anon_unknown_0::DXFEState::findClock
                     ((DXFEState *)pDVar8[2]._vptr_DecodingState,(int)pDVar8[3]._vptr_DecodingState,
                      uVar7);
  if (pCVar9 == (Clock *)0x0) goto LAB_00162670;
  if (puVar21 == (ushort *)0x0) {
    puVar21 = (ushort *)0x0;
  }
  else {
    puVar21 = puVar21 + next->_size;
    next->_data = puVar21;
  }
  dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar13 = next->_end;
  if (puVar21 + 1 <= puVar13 && (puVar32 <= puVar21 && puVar21 != (ushort *)0x0)) {
    iVar19 = 0;
    iVar29 = 0;
    bVar25 = pCVar9->hasFrameNr;
    if ((uint)bVar25 * 8 == -0xf) {
      bVar24 = true;
    }
    else {
      do {
        fVar35 = 31.0;
        if ((bVar25 & 1) == 0) {
          fVar35 = 23.0;
        }
        uVar33 = (uint)((float)*puVar21 / ((float)(pCVar9->xStop - pCVar9->xStart) / fVar35) + 0.5);
        if (uVar33 == 0) {
LAB_001627d7:
          puVar21 = puVar21 + 1;
          next->_data = puVar21;
        }
        else {
          do {
            uVar33 = uVar33 - 1;
            txt._M_dataplus._M_p._0_1_ =
                 ((uint)(((int)puVar21 - (int)puVar32) * 0x40000000 >> 0x1f) >> (uVar33 & 0x1f) & 1)
                 != 0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&dataBits._bits,(uchar *)&txt);
          } while (uVar33 != 0);
          puVar21 = next->_data;
          if (puVar21 != (ushort *)0x0) goto LAB_001627d7;
          puVar21 = (ushort *)0x0;
        }
        puVar32 = next->_base;
        puVar13 = next->_end;
        bVar24 = puVar32 <= puVar21 && puVar21 != (ushort *)0x0;
        iVar19 = (int)dataBits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        iVar29 = (int)dataBits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
        if ((puVar32 > puVar21 || puVar21 == (ushort *)0x0) || (puVar13 < puVar21 + 1))
        goto LAB_0016283a;
        bVar25 = pCVar9->hasFrameNr;
      } while (iVar29 - iVar19 < (int)((uint)bVar25 * 8 + 0xf));
      bVar24 = true;
    }
LAB_0016283a:
    if ((uint)pCVar9->hasFrameNr * 8 + 0xf == iVar29 - iVar19) {
      next->_size = 3;
      puVar21 = puVar21 + 3;
      if ((bool)(bVar24 & puVar21 <= puVar13)) {
        if (puVar21 == puVar13 + -1) {
          uVar33 = 0x7fffffff;
        }
        else {
          uVar33 = (uint)*puVar21;
        }
        dVar4 = IsPattern<false,3,3>
                          (next,(FixedPattern<3,_3,_false> *)
                                &(anonymous_namespace)::DATA_STOP_PATTERN,uVar33,0.5,0.0);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          uVar20 = (long)dataBits._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)dataBits._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (uVar20 == 0) {
            uVar26 = 0;
LAB_00162d8b:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar26);
          }
          if (*dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start == '\0') {
            if (uVar20 < 9) {
              uVar26 = 8;
              goto LAB_00162d8b;
            }
            if (dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[8] == '\0') {
              if (pCVar9->hasFrameNr == true) {
                if (uVar20 < 0x15) {
                  uVar26 = 0x14;
                  goto LAB_00162d8b;
                }
                if (dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start[0x14] != '\0') goto LAB_001628d5;
                if (uVar20 < 0x17) {
                  uVar26 = 0x16;
                  goto LAB_00162d8b;
                }
                uVar2 = dataBits._bits.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start[0x16];
              }
              else {
                if (uVar20 < 0xf) {
                  uVar26 = 0xe;
                  goto LAB_00162d8b;
                }
                uVar2 = dataBits._bits.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start[0xe];
              }
              if (uVar2 == '\0') {
                pbVar16 = dataBits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish + -2;
                bVar25 = 0;
                pbVar27 = dataBits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start != pbVar16) {
                  do {
                    bVar25 = bVar25 + *pbVar27;
                    pbVar27 = pbVar27 + 1;
                  } while (pbVar27 != pbVar16);
                  bVar25 = bVar25 & 1;
                }
                if (bVar25 == *pbVar16) {
                  iVar29 = (int)uVar20;
                  if (0 < iVar29) {
                    iVar19 = 7;
                    if (iVar29 < 7) {
                      iVar19 = iVar29;
                    }
                    lVar28 = 0;
                    __val = 0;
                    do {
                      __val = (uint)(dataBits._bits.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar28 + 1] != '\0')
                              + __val * 2;
                      lVar28 = lVar28 + 1;
                    } while (iVar19 != (int)lVar28);
                    if (__val != 0) {
                      iVar19 = 4;
                      if (iVar29 < 4) {
                        iVar19 = iVar29;
                      }
                      lVar28 = 0;
                      iVar29 = 0;
                      do {
                        iVar29 = (uint)(dataBits._bits.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar28 + 9] !=
                                       '\0') + iVar29 * 2;
                        lVar28 = lVar28 + 1;
                      } while (iVar19 != (int)lVar28);
                      txt._M_dataplus._M_p = (pointer)&txt.field_2;
                      txt._M_string_length = 0;
                      txt.field_2._M_local_buf[0] = '\0';
                      std::__cxx11::string::reserve((ulong)&txt);
                      std::__cxx11::to_string(&local_80,__val);
                      plVar14 = (long *)std::__cxx11::string::append((char *)&local_80);
                      paVar1 = &local_e0.field_2;
                      psVar17 = (size_type *)(plVar14 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar14 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar17) {
                        local_e0.field_2._M_allocated_capacity = *psVar17;
                        local_e0.field_2._8_8_ = plVar14[3];
                        local_e0._M_dataplus._M_p = (pointer)paVar1;
                      }
                      else {
                        local_e0.field_2._M_allocated_capacity = *psVar17;
                        local_e0._M_dataplus._M_p = (pointer)*plVar14;
                      }
                      local_e0._M_string_length = plVar14[1];
                      *plVar14 = (long)psVar17;
                      plVar14[1] = 0;
                      *(undefined1 *)(plVar14 + 2) = 0;
                      std::__cxx11::to_string(&local_a0,iVar29);
                      std::operator+(&local_c0,&local_e0,&local_a0);
                      std::__cxx11::string::operator=((string *)&txt,(string *)&local_c0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                        operator_delete(local_c0._M_dataplus._M_p,
                                        local_c0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                        operator_delete(local_a0._M_dataplus._M_p,
                                        local_a0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e0._M_dataplus._M_p != paVar1) {
                        operator_delete(local_e0._M_dataplus._M_p,
                                        local_e0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_80._M_dataplus._M_p != &local_80.field_2) {
                        operator_delete(local_80._M_dataplus._M_p,
                                        local_80.field_2._M_allocated_capacity + 1);
                      }
                      if (pCVar9->hasFrameNr == true) {
                        iVar29 = (int)dataBits._bits.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                 (int)dataBits._bits.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                        if (iVar29 < 1) {
                          iVar29 = 0;
                        }
                        else {
                          iVar19 = 6;
                          if (iVar29 < 6) {
                            iVar19 = iVar29;
                          }
                          lVar28 = 0;
                          iVar29 = 0;
                          do {
                            iVar29 = (uint)(dataBits._bits.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar28 + 0xd]
                                           != '\0') + iVar29 * 2;
                            lVar28 = lVar28 + 1;
                          } while (iVar19 != (int)lVar28);
                        }
                        std::__cxx11::to_string(&local_e0,iVar29);
                        std::operator+(&local_c0,"/",&local_e0);
                        std::__cxx11::string::_M_append
                                  ((char *)&txt,(ulong)local_c0._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                          operator_delete(local_c0._M_dataplus._M_p,
                                          local_c0.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_e0._M_dataplus._M_p != paVar1) {
                          operator_delete(local_e0._M_dataplus._M_p,
                                          local_e0.field_2._M_allocated_capacity + 1);
                        }
                        if ((ulong)((long)dataBits._bits.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)dataBits._bits.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start) < 0x14) {
                          std::__throw_out_of_range_fmt
                                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                     ,0x13);
                        }
                        if (dataBits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start[0x13] != '\0') {
                          std::__cxx11::string::append((char *)&txt);
                        }
                      }
                      puVar15 = next->_base;
                      if (puVar15 == next->_data + next->_size) {
                        iVar29 = -1;
                      }
                      else {
                        uVar18 = 0;
                        do {
                          uVar18 = uVar18 + *puVar15;
                          puVar15 = puVar15 + 1;
                        } while (puVar15 != next->_data + next->_size);
                        iVar29 = uVar18 - 1;
                      }
                      p.y = rowNumber;
                      p.x = iVar29;
                      bVar24 = anon_unknown_0::Clock::isCloseTo(pCVar9,p,pCVar9->xStop);
                      if (bVar24) {
                        pCVar9->xStart = uVar7;
                        pCVar9->xStop = iVar29;
                        paVar1 = &local_60._msg.field_2;
                        local_60._msg.field_2._M_allocated_capacity = 0;
                        local_60._msg.field_2._8_8_ = 0;
                        local_60._msg._M_string_length = 0;
                        local_60._file = (char *)0x0;
                        local_60._line = -1;
                        local_60._type = None;
                        local_60._43_5_ = 0;
                        local_60._msg._M_dataplus._M_p = (pointer)paVar1;
                        Result::Result(__return_storage_ptr__,&txt,rowNumber,uVar7,iVar29,DXFilmEdge
                                       ,(SymbologyIdentifier)0x0,&local_60,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_60._msg._M_dataplus._M_p != paVar1) {
                          operator_delete(local_60._msg._M_dataplus._M_p,
                                          local_60._msg.field_2._M_allocated_capacity + 1);
                        }
                      }
                      else {
                        memset(__return_storage_ptr__,0,0xd8);
                        Result::Result(__return_storage_ptr__);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)txt._M_dataplus._M_p != &txt.field_2) {
                        operator_delete(txt._M_dataplus._M_p,
                                        CONCAT71(txt.field_2._M_allocated_capacity._1_7_,
                                                 txt.field_2._M_local_buf[0]) + 1);
                      }
                      goto LAB_001628ec;
                    }
                  }
                  memset(__return_storage_ptr__,0,0xd8);
                  Result::Result(__return_storage_ptr__);
                }
                else {
                  memset(__return_storage_ptr__,0,0xd8);
                  Result::Result(__return_storage_ptr__);
                }
                goto LAB_001628ec;
              }
            }
          }
        }
      }
    }
  }
LAB_001628d5:
  memset(__return_storage_ptr__,0,0xd8);
  Result::Result(__return_storage_ptr__);
LAB_001628ec:
  if (dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)dataBits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)dataBits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode DXFilmEdgeReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>& state) const
{
	if (!state) {
		state.reset(new DXFEState);
		static_cast<DXFEState*>(state.get())->centerRow = rowNumber;
	}

	auto dxState = static_cast<DXFEState*>(state.get());

	// Only consider rows below the center row of the image
	if (!_opts.tryRotate() && rowNumber < dxState->centerRow)
		return {};

	// Look for a pattern that is part of both the clock as well as the data track (ommitting the first bar)
	constexpr auto Is4x1 = [](const PatternView& view, int spaceInPixel) {
		// find min/max of 4 consecutive bars/spaces and make sure they are close together
		auto [m, M] = std::minmax({view[1], view[2], view[3], view[4]});
		return M <= m * 4 / 3 + 1 && spaceInPixel > m / 2;
	};

	// 12 is the minimum size of the data track (at least one product class bit + one parity bit)
	next = FindLeftGuard<4>(next, 10, Is4x1);
	if (!next.isValid())
		return {};

	// Check if the 4x1 pattern is part of a clock track
	if (auto clock = CheckForClock(rowNumber, next)) {
		dxState->addClock(*clock);
		next.skipSymbol();
		return {};
	}

	// Without at least one clock track, we stop here
	if (dxState->clocks.empty())
		return {};

	constexpr float minDataQuietZone = 0.5;

	if (!IsPattern(next, DATA_START_PATTERN, minDataQuietZone))
		return {};

	auto xStart = next.pixelsInFront();

	// Only consider data tracks that are next to a clock track
	auto clock = dxState->findClock(xStart, rowNumber);
	if (!clock)
		return {};

	// Skip the data start pattern (black, white, black, white, black)
	// The first signal bar is always white: this is the
	// separation between the start pattern and the product number
	next.skipSymbol();

	// Read the data bits
	BitArray dataBits;
	while (next.isValid(1) && dataBits.size() < clock->dataLength()) {

		int modules = int(next[0] / clock->moduleSize() + 0.5);
		// even index means we are at a bar, otherwise at a space
		dataBits.appendBits(next.index() % 2 == 0 ? 0xFFFFFFFF : 0x0, modules);

		next.shift(1);
	}

	// Check the data track length
	if (dataBits.size() != clock->dataLength())
		return {};

	next = next.subView(0, DATA_STOP_PATTERN.size());

	// Check there is the Stop pattern at the end of the data track
	if (!next.isValid() || !IsRightGuard(next, DATA_STOP_PATTERN, minDataQuietZone))
		return {};

	// The following bits are always white (=false), they are separators.
	if (dataBits.get(0) || dataBits.get(8) || (clock->hasFrameNr ? (dataBits.get(20) || dataBits.get(22)) : dataBits.get(14)))
		return {};

	// Check the parity bit
	auto signalSum = Reduce(dataBits.begin(), dataBits.end() - 2, 0);
	auto parityBit = *(dataBits.end() - 2);
	if (signalSum % 2 != (int)parityBit)
		return {};

	// Compute the DX 1 number (product number)
	auto productNumber = ToInt(dataBits, 1, 7);
	if (!productNumber)
		return {};

	// Compute the DX 2 number (generation number)
	auto generationNumber = ToInt(dataBits, 9, 4);

	// Generate the textual representation.
	// Eg: 115-10/11A means: DX1 = 115, DX2 = 10, Frame number = 11A
	std::string txt;
	txt.reserve(10);
	txt = std::to_string(productNumber) + "-" + std::to_string(generationNumber);
	if (clock->hasFrameNr) {
		auto frameNr = ToInt(dataBits, 13, 6);
		txt += "/" + std::to_string(frameNr);
		if (dataBits.get(19))
			txt += "A";
	}

	auto xStop = next.pixelsTillEnd();

	// The found data track must end near the clock track
	if (!clock->isCloseToStop(xStop, rowNumber))
		return {};

	// Update the clock coordinates with the latest corresponding data track
	// This may improve signal detection for next row iterations
	clock->xStart = xStart;
	clock->xStop = xStop;

	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::DXFilmEdge, {});
}